

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

archive * archive_write_disk_new(void)

{
  __mode_t __mask;
  __uid_t _Var1;
  archive_vtable_conflict *paVar2;
  time_t tVar3;
  archive_string *paVar4;
  archive_write_disk *a;
  
  a = (archive_write_disk *)malloc(0x318);
  if (a == (archive_write_disk *)0x0) {
    a = (archive_write_disk *)0x0;
  }
  else {
    memset(a,0,0x318);
    (a->archive).magic = 0xc001b0c5;
    (a->archive).state = 2;
    paVar2 = archive_write_disk_vtable();
    (a->archive).vtable = paVar2;
    tVar3 = time((time_t *)0x0);
    a->start_time = tVar3;
    __mask = umask(0);
    a->user_umask = __mask;
    umask(__mask);
    _Var1 = geteuid();
    a->user_uid = (ulong)_Var1;
    paVar4 = archive_string_ensure(&a->path_safe,0x200);
    if (paVar4 == (archive_string *)0x0) {
      free(a);
      a = (archive_write_disk *)0x0;
    }
    else {
      a->decmpfs_compression_level = L'\x05';
    }
  }
  return &a->archive;
}

Assistant:

struct archive *
archive_write_disk_new(void)
{
	struct archive_write_disk *a;

	a = (struct archive_write_disk *)malloc(sizeof(*a));
	if (a == NULL)
		return (NULL);
	memset(a, 0, sizeof(*a));
	a->archive.magic = ARCHIVE_WRITE_DISK_MAGIC;
	/* We're ready to write a header immediately. */
	a->archive.state = ARCHIVE_STATE_HEADER;
	a->archive.vtable = archive_write_disk_vtable();
	a->start_time = time(NULL);
	/* Query and restore the umask. */
	umask(a->user_umask = umask(0));
#ifdef HAVE_GETEUID
	a->user_uid = geteuid();
#endif /* HAVE_GETEUID */
	if (archive_string_ensure(&a->path_safe, 512) == NULL) {
		free(a);
		return (NULL);
	}
#ifdef HAVE_ZLIB_H
	a->decmpfs_compression_level = 5;
#endif
	return (&a->archive);
}